

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O0

vector<Image,_std::allocator<Image>_> *
LoadCgaSpritesheet(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *filename)

{
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string *filename_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  ReadBinaryFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,filename);
  anon_unknown.dwarf_f7f8::LoadCgaSpritesheet
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadCgaSpritesheet(std::string const& filename) {
  auto const data = ReadBinaryFile(filename);
  return LoadCgaSpritesheet(data);
}